

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

void fctkern__log_test_skip(fctkern_t *nk,char *condition,char *name)

{
  size_t sVar1;
  void *pvVar2;
  size_t idx;
  
  sVar1 = (nk->logger_list).used_itm_num;
  for (idx = 0; sVar1 != idx; idx = idx + 1) {
    pvVar2 = fct_nlist__at(&nk->logger_list,idx);
    *(char **)((long)pvVar2 + 0x80) = condition;
    *(char **)((long)pvVar2 + 0x88) = name;
    (**(code **)((long)pvVar2 + 0x50))(pvVar2,(long)pvVar2 + 0x58);
  }
  return;
}

Assistant:

FCT_NLIST_FOREACH_BGN(fct_logger_i*, logger, &(nk->logger_list))
    {
        fct_logger__on_test_skip(logger, condition, name);
    }